

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

void us_listen_socket_close(int ssl,us_listen_socket_t *ls)

{
  us_socket_context_t *puVar1;
  us_socket_t *puVar2;
  us_loop_t *puVar3;
  int iVar4;
  us_socket_t *puVar5;
  
  iVar4 = us_socket_is_closed(0,&ls->s);
  if (iVar4 == 0) {
    puVar1 = (ls->s).context;
    puVar5 = (ls->s).next;
    if ((us_listen_socket_t *)puVar1->iterator == ls) {
      puVar1->iterator = puVar5;
    }
    puVar2 = (ls->s).prev;
    if (puVar2 == puVar5) {
      puVar1->head = (us_socket_t *)0x0;
    }
    else {
      if (puVar2 == (us_socket_t *)0x0) {
        puVar1->head = puVar5;
      }
      else {
        puVar2->next = puVar5;
        puVar5 = (ls->s).next;
      }
      if (puVar5 != (us_socket_t *)0x0) {
        puVar5->prev = puVar2;
      }
    }
    us_poll_stop((us_poll_t *)ls,puVar1->loop);
    iVar4 = us_poll_fd((us_poll_t *)ls);
    close(iVar4);
    puVar1 = (ls->s).context;
    puVar3 = puVar1->loop;
    (ls->s).next = (puVar3->data).closed_head;
    (puVar3->data).closed_head = &ls->s;
    (ls->s).prev = (us_socket_t *)puVar1;
  }
  return;
}

Assistant:

void us_listen_socket_close(int ssl, struct us_listen_socket_t *ls) {
    /* us_listen_socket_t extends us_socket_t so we close in similar ways */
    if (!us_socket_is_closed(0, &ls->s)) {
        us_internal_socket_context_unlink(ls->s.context, &ls->s);
        us_poll_stop((struct us_poll_t *) &ls->s, ls->s.context->loop);
        bsd_close_socket(us_poll_fd((struct us_poll_t *) &ls->s));

        /* Link this socket to the close-list and let it be deleted after this iteration */
        ls->s.next = ls->s.context->loop->data.closed_head;
        ls->s.context->loop->data.closed_head = &ls->s;

        /* Any socket with prev = context is marked as closed */
        ls->s.prev = (struct us_socket_t *) ls->s.context;
    }

    /* We cannot immediately free a listen socket as we can be inside an accept loop */
}